

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O2

bool_t gf2Create(qr_o *f,size_t *p,void *stack)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  code *pcVar8;
  bool_t bVar9;
  ulong uVar10;
  size_t sVar11;
  
  uVar10 = p[1];
  bVar9 = 0;
  if (uVar10 != 0) {
    uVar2 = p[2];
    uVar3 = p[3];
    if (uVar2 == 0) {
      if (uVar3 != 0) {
        return 0;
      }
      uVar2 = *p;
      if (uVar2 - uVar10 < 0x40) {
        return 0;
      }
      if (uVar2 <= uVar10) {
        return 0;
      }
      if ((uVar2 & 7) == 0) {
        return 0;
      }
      uVar10 = uVar2 + 0x3f >> 6;
      f->n = uVar10;
      sVar5 = uVar10 + ((*p & 0x3f) == 0);
      f->no = *p + 7 >> 3;
      f->mod = (word *)(f + 1);
      wwSetZero((word *)(f + 1),sVar5);
      wwSetBit(f->mod,*p,1);
      wwSetBit(f->mod,p[1],1);
      wwSetBit(f->mod,0,1);
      f->unity = f->mod + sVar5;
      wwSetW(f->mod + sVar5,f->n,1);
      psVar1 = f->unity + f->n;
      f->params = psVar1;
      *psVar1 = *p;
      psVar1[1] = p[1];
      psVar1[2] = 0;
      psVar1[3] = 0;
      psVar1[4] = (ulong)((uint)*p & 0x3f);
      psVar1[5] = *p >> 6;
      psVar1[6] = (ulong)((int)*p - (int)p[1] & 0x3f);
      psVar1[7] = *p - p[1] >> 6;
      f->from = gf2From;
      f->to = gf2To;
      f->add = gf2Add3;
      f->sub = gf2Add3;
      f->neg = gf2Neg2;
      pcVar8 = gf2MulTrinomial1;
      if (psVar1[6] == 0) {
        pcVar8 = gf2MulTrinomial0;
      }
      f->mul = pcVar8;
      pcVar8 = gf2SqrTrinomial1;
      if (psVar1[6] == 0) {
        pcVar8 = gf2SqrTrinomial0;
      }
      f->sqr = pcVar8;
      f->inv = gf2Inv;
      f->div = gf2Div;
      sVar11 = f->n;
      (f->hdr).keep = (sVar5 + sVar11) * 8 + 0xd0;
      (f->hdr).p_count = 3;
      (f->hdr).o_count = 0;
      if (psVar1[6] == 0) {
        sVar5 = gf2MulTrinomial0_deep(sVar11);
      }
      else {
        sVar5 = gf2MulTrinomial1_deep(sVar11);
      }
    }
    else {
      if (uVar3 == 0) {
        return 0;
      }
      if (0x3f < uVar10) {
        return 0;
      }
      uVar4 = *p;
      if (uVar4 - uVar10 < 0x40) {
        return 0;
      }
      if (uVar2 <= uVar3) {
        return 0;
      }
      if (uVar10 <= uVar2) {
        return 0;
      }
      if (uVar4 <= uVar10) {
        return 0;
      }
      uVar10 = uVar4 + 0x3f >> 6;
      f->n = uVar10;
      sVar11 = uVar10 + ((*p & 0x3f) == 0);
      f->no = *p + 7 >> 3;
      f->mod = (word *)(f + 1);
      wwSetZero((word *)(f + 1),sVar11);
      wwSetBit(f->mod,*p,1);
      wwSetBit(f->mod,p[1],1);
      wwSetBit(f->mod,p[2],1);
      wwSetBit(f->mod,p[3],1);
      wwSetBit(f->mod,0,1);
      f->unity = f->mod + sVar11;
      wwSetW(f->mod + sVar11,f->n,1);
      psVar1 = f->unity + f->n;
      f->params = psVar1;
      *psVar1 = *p;
      psVar1[1] = p[1];
      psVar1[2] = p[2];
      psVar1[3] = p[3];
      psVar1[4] = (ulong)((uint)*p & 0x3f);
      psVar1[5] = *p >> 6;
      psVar1[6] = (ulong)((int)*p - (int)p[1] & 0x3f);
      psVar1[7] = *p - p[1] >> 6;
      psVar1[8] = (ulong)((int)*p - (int)p[2] & 0x3f);
      psVar1[9] = *p - p[2] >> 6;
      psVar1[10] = (ulong)((int)*p - (int)p[3] & 0x3f);
      psVar1[0xb] = *p - p[3] >> 6;
      f->from = gf2From;
      f->to = gf2To;
      f->add = gf2Add3;
      f->sub = gf2Add3;
      f->neg = gf2Neg2;
      f->mul = gf2MulPentanomial;
      f->sqr = gf2SqrPentanomial;
      f->inv = gf2Inv;
      f->div = gf2Div;
      sVar5 = f->n;
      (f->hdr).keep = (sVar11 + sVar5) * 8 + 0xf0;
      (f->hdr).p_count = 3;
      (f->hdr).o_count = 0;
      sVar5 = gf2MulPentanomial_deep(sVar5);
    }
    bVar9 = 1;
    sVar11 = ppSqr_deep(f->n);
    sVar6 = gf2Inv_deep(f->n);
    sVar7 = gf2Div_deep(f->n);
    sVar5 = utilMax(4,sVar5,sVar11,sVar6,sVar7);
    f->deep = sVar5;
  }
  return bVar9;
}

Assistant:

bool_t gf2Create(qr_o* f, const size_t p[4], void* stack)
{
	ASSERT(memIsValid(f, sizeof(qr_o)));
	ASSERT(memIsValid(p, 4 * sizeof(size_t)));
	// нормальный базис?
	if (p[1] == 0)
	{
		// todo: реализовать
		return FALSE;
	}
	// трехчлен?
	else if (p[2] == 0)
	{
		gf2_trinom_st* t;
		size_t n1;
		// нарушены соглашения?
		if (p[3] != 0)
			return FALSE;
		// нарушены условия функции ppRedTrinomial?
		if (p[0] % 8 == 0 || p[1] >= p[0] || p[0] - p[1] < B_PER_W)
			return FALSE;
		// зафиксировать размерность
		f->n = W_OF_B(p[0]);
		n1 = f->n + (p[0] % B_PER_W == 0);
		f->no = O_OF_B(p[0]);
		// сформировать mod
		f->mod = (word*)f->descr;
		wwSetZero(f->mod, n1);
		wwSetBit(f->mod, p[0], 1);
		wwSetBit(f->mod, p[1], 1);
		wwSetBit(f->mod, 0, 1);
		// сформировать unity
		f->unity = f->mod + n1;
		wwSetW(f->unity, f->n, 1);
		// сформировать params
		f->params = (size_t*)(f->unity + f->n);
		t = (gf2_trinom_st*)f->params;
		t->m = p[0];
		t->k = p[1];
		t->l = t->l1 = 0;
		t->bm = p[0] % B_PER_W;
		t->wm = p[0] / B_PER_W;
		t->bk = (p[0] - p[1]) % B_PER_W;
		t->wk = (p[0] - p[1]) / B_PER_W;
		// настроить интерфейсы
		f->from = gf2From;
		f->to = gf2To;
		f->add = gf2Add3;
		f->sub = gf2Add3;
		f->neg = gf2Neg2;
		f->mul = t->bk == 0 ? gf2MulTrinomial0 : gf2MulTrinomial1;
		f->sqr = t->bk == 0 ? gf2SqrTrinomial0 : gf2SqrTrinomial1;
		f->inv = gf2Inv;
		f->div = gf2Div;
		// заголовок
		f->hdr.keep = sizeof(qr_o) + O_OF_W(n1 + f->n) + sizeof(gf2_trinom_st);
		f->hdr.p_count = 3;
		f->hdr.o_count = 0;
		// глубина стека
		if (t->bk == 0)
			f->deep = utilMax(4,
				gf2MulTrinomial0_deep(f->n),
				gf2SqrTrinomial0_deep(f->n),
				gf2Inv_deep(f->n),
				gf2Div_deep(f->n));
		else 
			f->deep = utilMax(4,
				gf2MulTrinomial1_deep(f->n),
				gf2SqrTrinomial1_deep(f->n),
				gf2Inv_deep(f->n),
				gf2Div_deep(f->n));
	}
	// пятичлен?
	else
	{
		gf2_pentanom_st* t;
		size_t n1;
		// нарушены соглашения?
		if (p[3] == 0)
			return FALSE;
		// нарушены условия функции ppRedPentanomial?
		if (p[1] >= p[0] || p[2] >= p[1] || p[3] >= p[2] || 
			p[0] - p[1] < B_PER_W || p[1] >= B_PER_W)
			return FALSE;
		// зафиксировать размерность
		f->n = W_OF_B(p[0]);
		n1 = f->n + (p[0] % B_PER_W == 0);
		f->no = O_OF_B(p[0]);
		// сформировать mod
		f->mod = (word*)f->descr;
		wwSetZero(f->mod, n1);
		wwSetBit(f->mod, p[0], 1);
		wwSetBit(f->mod, p[1], 1);
		wwSetBit(f->mod, p[2], 1);
		wwSetBit(f->mod, p[3], 1);
		wwSetBit(f->mod, 0, 1);
		// сформировать unity
		f->unity = f->mod + n1;
		wwSetW(f->unity, f->n, 1);
		// сформировать params
		f->params = (size_t*)(f->unity + f->n);
		t = (gf2_pentanom_st*)f->params;
		t->m = p[0];
		t->k = p[1];
		t->l = p[2];
		t->l1 = p[3];
		t->bm = p[0] % B_PER_W;
		t->wm = p[0] / B_PER_W;
		t->bk = (p[0] - p[1]) % B_PER_W;
		t->wk = (p[0] - p[1]) / B_PER_W;
		t->bl = (p[0] - p[2]) % B_PER_W;
		t->wl = (p[0] - p[2]) / B_PER_W;
		t->bl1 = (p[0] - p[3]) % B_PER_W;
		t->wl1 = (p[0] - p[3]) / B_PER_W;
		// настроить интерфейсы
		f->from = gf2From;
		f->to = gf2To;
		f->add = gf2Add3;
		f->sub = gf2Add3;
		f->neg = gf2Neg2;
		f->mul = gf2MulPentanomial;
		f->sqr = gf2SqrPentanomial;
		f->inv = gf2Inv;
		f->div = gf2Div;
		// заголовок
		f->hdr.keep = sizeof(qr_o) + O_OF_W(n1 + f->n) + 
			sizeof(gf2_pentanom_st);
		f->hdr.p_count = 3;
		f->hdr.o_count = 0;
		// глубина стека
		f->deep = utilMax(4,
			gf2MulPentanomial_deep(f->n),
			gf2SqrPentanomial_deep(f->n),
			gf2Inv_deep(f->n),
			gf2Div_deep(f->n));
	}
	return TRUE;
}